

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
           *this,InternalString *key,RegexStats **value)

{
  long lVar1;
  BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
  *pBVar2;
  char *addr;
  code *pcVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  char16_t *pcVar13;
  uint uVar14;
  ulong uVar15;
  char16_t *string1;
  uint uVar16;
  uint uVar17;
  hash_t local_38;
  
  lVar11 = *(long *)this;
  if (lVar11 == 0) {
    BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar11 = *(long *)this;
  }
  if ((ulong)key->m_charLength == 0) {
    uVar12 = 0x2393b8b;
  }
  else {
    uVar12 = 0x811c9dc5;
    uVar10 = 0;
    do {
      uVar14 = *(ushort *)
                ((long)(key->m_content).ptr + uVar10 * 2 + (ulong)((uint)key->m_offset * 2)) ^
               uVar12;
      uVar12 = uVar14 * 0x1000193;
      uVar10 = uVar10 + 1;
    } while (key->m_charLength != uVar10);
    uVar12 = uVar14 * 0x2000326 + 1;
  }
  local_38 = PrimePolicy::ModPrime(uVar12 >> 1,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar14 = *(uint *)(lVar11 + (ulong)local_38 * 4);
  if ((int)uVar14 < 0) {
    cVar4 = (char)(uVar14 >> 0x18);
    uVar17 = 0;
  }
  else {
    lVar11 = *(long *)(this + 8);
    uVar17 = 0;
    puVar7 = (undefined4 *)__tls_get_addr();
    do {
      uVar10 = (ulong)uVar14;
      uVar9 = (ulong)*(uint *)(lVar11 + 0x10 + uVar10 * 0x28);
      if (uVar9 == 0) {
        iVar8 = 0x2393b8b;
      }
      else {
        uVar14 = 0x811c9dc5;
        uVar15 = 0;
        do {
          uVar16 = *(ushort *)
                    ((ulong)((uint)*(byte *)(lVar11 + 0x14 + uVar10 * 0x28) * 2) +
                     *(long *)(lVar11 + 0x18 + uVar10 * 0x28) + uVar15 * 2) ^ uVar14;
          uVar14 = uVar16 * 0x1000193;
          uVar15 = uVar15 + 1;
        } while (uVar9 != uVar15);
        iVar8 = uVar16 * 0x2000326 + 1;
      }
      lVar1 = lVar11 + uVar10 * 0x28;
      if (iVar8 != *(int *)(lVar1 + 0x20)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                           ,199,
                           "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                           ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
        if (!bVar5) goto LAB_00f110e6;
        *puVar7 = 0;
      }
      if ((*(uint *)(lVar1 + 0x20) == uVar12) && (*(uint *)(lVar1 + 0x10) == key->m_charLength)) {
        string1 = (char16_t *)((ulong)((uint)*(byte *)(lVar1 + 0x14) * 2) + *(long *)(lVar1 + 0x18))
        ;
        pcVar13 = (char16_t *)((ulong)((uint)key->m_offset * 2) + (long)(key->m_content).ptr);
        if ((string1 == pcVar13) ||
           (iVar8 = PAL_wmemcmp(string1,pcVar13,(ulong)*(uint *)(lVar1 + 0x10)), iVar8 == 0)) {
          if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar17);
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                             ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
          if (bVar5) {
            *puVar7 = 0;
            return -1;
          }
          goto LAB_00f110e6;
        }
      }
      uVar17 = uVar17 + 1;
      uVar14 = *(uint *)(lVar1 + 8);
    } while (-1 < (int)uVar14);
    cVar4 = (char)(uVar14 >> 0x18);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar17);
  }
  iVar8 = -1;
  if (cVar4 < '\0') {
    if (*(int *)(this + 0x28) == 0) {
      iVar8 = *(int *)(this + 0x20);
      if (iVar8 == *(int *)(this + 0x18)) {
        BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
        ::Resize((BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                  *)this);
        local_38 = PrimePolicy::ModPrime(uVar12 >> 1,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
        iVar8 = *(int *)(this + 0x20);
      }
      *(int *)(this + 0x20) = iVar8 + 1;
      if (*(int *)(this + 0x18) < iVar8 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f1,"(count <= size)","count <= size");
        if (!bVar5) goto LAB_00f110e6;
        *puVar7 = 0;
      }
      if (*(int *)(this + 0x18) <= iVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f2,"(index < size)","index < size");
        if (!bVar5) goto LAB_00f110e6;
        *puVar7 = 0;
      }
    }
    else {
      if (*(int *)(this + 0x28) < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar5) goto LAB_00f110e6;
        *puVar7 = 0;
      }
      if (*(int *)(this + 0x24) < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar5) goto LAB_00f110e6;
        *puVar7 = 0;
      }
      if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar5) {
LAB_00f110e6:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      iVar8 = *(int *)(this + 0x24);
      pBVar2 = this + 0x28;
      *(int *)pBVar2 = *(int *)pBVar2 + -1;
      if (*(int *)pBVar2 != 0) {
        iVar6 = BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                ::GetNextFreeEntryIndex((EntryType *)((long)iVar8 * 0x28 + *(long *)(this + 8)));
        *(int *)(this + 0x24) = iVar6;
      }
    }
    addr = (char *)(*(long *)(this + 8) + 0x18 + (long)iVar8 * 0x28);
    *(RegexStats **)(addr + -0x18) = *value;
    *(Type *)(addr + -8) = key->m_charLength;
    addr[-4] = key->m_offset;
    pcVar13 = (key->m_content).ptr;
    Memory::Recycler::WBSetBit(addr);
    *(char16_t **)addr = pcVar13;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    *(uint *)(addr + 8) = uVar12;
    lVar11 = *(long *)this;
    lVar1 = *(long *)(this + 8);
    *(undefined4 *)(lVar1 + 8 + (long)iVar8 * 0x28) = *(undefined4 *)(lVar11 + (ulong)local_38 * 4);
    *(int *)(lVar11 + (ulong)local_38 * 4) = iVar8;
    uVar17 = 0;
    iVar6 = iVar8;
    do {
      iVar6 = *(int *)(lVar1 + 8 + (long)iVar6 * 0x28);
      uVar17 = uVar17 + 1;
    } while (iVar6 != -1);
    if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar17);
    }
  }
  return iVar8;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }